

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_FunctionBuilder.h
# Opt level: O3

void __thiscall
soul::FunctionBuilder::addBranch
          (FunctionBuilder *this,Block *target,
          initializer_list<soul::pool_ref<soul::heart::Expression>_> targetArgs,
          pool_ptr<soul::heart::Block> *subsequentBlock)

{
  PoolItem *pPVar1;
  long lVar2;
  long lVar3;
  pool_ptr<soul::heart::Block> local_38;
  
  pPVar1 = PoolAllocator::allocateSpaceForObject
                     (&((this->super_BlockBuilder).module)->allocator->pool,0x58);
  *(undefined8 *)&pPVar1->field_0x18 = 0;
  pPVar1[1].size = 0;
  pPVar1->item = &PTR__Branch_002cfee0;
  pPVar1[1].destructor = (DestructorFn *)target;
  pPVar1[1].item = &pPVar1[2].destructor;
  *(undefined8 *)&pPVar1[1].field_0x18 = 0;
  pPVar1[2].size = 4;
  pPVar1->destructor =
       PoolAllocator::allocate<soul::heart::Branch,_soul::heart::Block_&>::anon_class_1_0_00000001::
       __invoke;
  if (targetArgs._M_len != 0) {
    lVar3 = 0;
    lVar2 = 0;
    do {
      ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::reserve
                ((ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> *)
                 &pPVar1[1].item,lVar2 + 1);
      lVar2 = *(long *)&pPVar1[1].field_0x18;
      *(undefined8 *)((long)pPVar1[1].item + lVar2 * 8) =
           *(undefined8 *)((long)&(targetArgs._M_array)->object + lVar3);
      lVar2 = lVar2 + 1;
      *(long *)&pPVar1[1].field_0x18 = lVar2;
      lVar3 = lVar3 + 8;
    } while (targetArgs._M_len << 3 != lVar3);
  }
  local_38 = (pool_ptr<soul::heart::Block>)subsequentBlock->object;
  addTerminatorStatement(this,(Terminator *)&pPVar1->item,&local_38);
  return;
}

Assistant:

void addBranch (heart::Block& target, std::initializer_list<pool_ref<heart::Expression>> targetArgs, pool_ptr<heart::Block> subsequentBlock)
    {
        auto& branch = module.allocate<heart::Branch> (target);

        for (auto& a : targetArgs)
            branch.targetArgs.push_back (a);

        addTerminatorStatement (branch, subsequentBlock);
    }